

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManCollectTopXors_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vXors)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  int Entry;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *pGStack_38;
  Gia_Obj_t *local_30;
  
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
    iVar2 = Gia_ObjRecognizeExor(pObj,&local_30,&pGStack_38);
    if (iVar2 == 0) {
      uVar3 = (uint)*(ulong *)pObj;
      uVar4 = *(ulong *)pObj & 0x1fffffff;
      if (-1 < (int)uVar3 && uVar4 != 0x1fffffff) {
        iVar2 = (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555;
        if ((uVar3 >> 0x1d & 1) == 0) {
          Gia_ManCollectTopXors_rec(p,pObj + -uVar4,vXors);
        }
        else {
          Entry = iVar2 - (uVar3 & 0x1fffffff);
          if (0 < (long)vXors->nSize) {
            lVar5 = 0;
            do {
              if (vXors->pArray[lVar5] == Entry) goto LAB_001f4dfc;
              lVar5 = lVar5 + 1;
            } while (vXors->nSize != lVar5);
          }
          Vec_IntPush(vXors,Entry);
        }
LAB_001f4dfc:
        uVar3 = (uint)(*(ulong *)pObj >> 0x20) & 0x1fffffff;
        if ((*(ulong *)pObj >> 0x3d & 1) == 0) {
          Gia_ManCollectTopXors_rec(p,pObj + -(ulong)uVar3,vXors);
          return;
        }
        iVar2 = iVar2 - uVar3;
        if (0 < (long)vXors->nSize) {
          lVar5 = 0;
          do {
            if (vXors->pArray[lVar5] == iVar2) {
              return;
            }
            lVar5 = lVar5 + 1;
          } while (vXors->nSize != lVar5);
        }
        goto LAB_001f4d8f;
      }
    }
    pGVar1 = p->pObjs;
    if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
      iVar2 = (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555;
      if (0 < (long)vXors->nSize) {
        lVar5 = 0;
        do {
          if (vXors->pArray[lVar5] == iVar2) {
            return;
          }
          lVar5 = lVar5 + 1;
        } while (vXors->nSize != lVar5);
      }
LAB_001f4d8f:
      Vec_IntPush(vXors,iVar2);
      return;
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManCollectTopXors_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vXors )
{
    Gia_Obj_t * pFan0, * pFan1;
    int iObj = Gia_ObjId( p, pObj );
    if ( Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) || !Gia_ObjIsAnd(pObj) )
    {
        Vec_IntPushUnique( vXors, Gia_ObjId(p, pObj) );
        return;
    }
    if ( Gia_ObjFaninC0(pObj) )
        Vec_IntPushUnique( vXors, Gia_ObjFaninId0(pObj, iObj) );
    else
        Gia_ManCollectTopXors_rec( p, Gia_ObjFanin0(pObj), vXors );
    if ( Gia_ObjFaninC1(pObj) )
        Vec_IntPushUnique( vXors, Gia_ObjFaninId1(pObj, iObj) );
    else
        Gia_ManCollectTopXors_rec( p, Gia_ObjFanin1(pObj), vXors );
}